

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

void * unodb::detail::allocate_aligned(size_t size,size_t alignment)

{
  uint __line;
  int iVar1;
  undefined8 *puVar2;
  char *__assertion;
  void *local_20;
  void *result;
  
  test::allocation_failure_injector::maybe_fail();
  iVar1 = posix_memalign(&local_20,alignment,size);
  if (iVar1 != 0) {
    local_20 = (void *)0x0;
    if (iVar1 == 0x16) {
      __assertion = "err != 22";
      __line = 0x3e;
      goto LAB_001755ac;
    }
    local_20 = (void *)0x0;
  }
  if (iVar1 == 0xc || local_20 != (void *)0x0) {
    if (local_20 == (void *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = dup2;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    return local_20;
  }
  __assertion = "result != nullptr || err == 12";
  __line = 0x40;
LAB_001755ac:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./heap.hpp"
                ,__line,"void *unodb::detail::allocate_aligned(std::size_t, std::size_t)");
}

Assistant:

[[nodiscard]] inline void* allocate_aligned(
    std::size_t size,
    std::size_t alignment = __STDCPP_DEFAULT_NEW_ALIGNMENT__) {
#ifndef NDEBUG
  unodb::test::allocation_failure_injector::maybe_fail();
#endif

  void* result;

#ifndef _MSC_VER
  const auto err = posix_memalign(&result, alignment, size);
  if (UNODB_DETAIL_UNLIKELY(err != 0)) result = nullptr;
#else
  result = _aligned_malloc(size, alignment);
#ifndef NDEBUG
  const auto err = UNODB_DETAIL_LIKELY(result != nullptr) ? 0 : errno;
#endif
#endif

  UNODB_DETAIL_ASSERT(err != EINVAL);
  // NOLINTNEXTLINE(readability-simplify-boolean-expr)
  UNODB_DETAIL_ASSERT(result != nullptr || err == ENOMEM);

  if (UNODB_DETAIL_UNLIKELY(result == nullptr)) {
    throw std::bad_alloc{};  // LCOV_EXCL_LINE
  }

  return result;
}